

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flags_common.c
# Opt level: O1

lzma_ret lzma_stream_flags_compare(lzma_stream_flags *a,lzma_stream_flags *b)

{
  ulong uVar1;
  ulong uVar2;
  lzma_ret lVar3;
  
  lVar3 = LZMA_OPTIONS_ERROR;
  if ((a->version == 0) && (b->version == 0)) {
    lVar3 = LZMA_PROG_ERROR;
    if ((a->check < 0x10) && (b->check < 0x10)) {
      if (a->check != b->check) {
        return LZMA_DATA_ERROR;
      }
      uVar1 = a->backward_size;
      if (((uVar1 == 0xffffffffffffffff) || (uVar2 = b->backward_size, uVar2 == 0xffffffffffffffff))
         || (((uVar1 & 3) == 0 && uVar1 - 4 < 0x3fffffffd &&
             (((uVar2 & 3) == 0 && uVar2 - 4 < 0x3fffffffd &&
              (lVar3 = LZMA_DATA_ERROR, uVar1 == uVar2)))))) {
        return LZMA_OK;
      }
    }
  }
  return lVar3;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_stream_flags_compare(
		const lzma_stream_flags *a, const lzma_stream_flags *b)
{
	// We can compare only version 0 structures.
	if (a->version != 0 || b->version != 0)
		return LZMA_OPTIONS_ERROR;

	// Check type
	if ((unsigned int)(a->check) > LZMA_CHECK_ID_MAX
			|| (unsigned int)(b->check) > LZMA_CHECK_ID_MAX)
		return LZMA_PROG_ERROR;

	if (a->check != b->check)
		return LZMA_DATA_ERROR;

	// Backward Sizes are compared only if they are known in both.
	if (a->backward_size != LZMA_VLI_UNKNOWN
			&& b->backward_size != LZMA_VLI_UNKNOWN) {
		if (!is_backward_size_valid(a) || !is_backward_size_valid(b))
			return LZMA_PROG_ERROR;

		if (a->backward_size != b->backward_size)
			return LZMA_DATA_ERROR;
	}

	return LZMA_OK;
}